

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlcatalog.c
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  char **ppcVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  FILE *pFVar11;
  byte *pbVar12;
  uint uVar13;
  char *pcVar14;
  int iVar15;
  uint uVar16;
  char *pcVar17;
  bool bVar18;
  char command [100];
  char arg [400];
  int local_2e8;
  undefined4 local_2d8;
  char cStack_2d4;
  undefined1 uStack_2d3;
  undefined1 uStack_2d2;
  undefined1 uStack_2d1;
  long local_268 [20];
  byte local_1c8 [408];
  
  if (argc < 2) {
    printf("Usage : %s [options] catalogfile entities...\n\tParse the catalog file (void specification possibly expressed as \"\"\n\tappoints the default system one) and query it for the entities\n\t--sgml : handle SGML Super catalogs for --add and --del\n\t--shell : run a shell allowing interactive queries\n\t--create : create a new catalog\n\t--add \'type\' \'orig\' \'replace\' : add an XML entry\n\t--add \'entry\' : add an SGML entry\n"
           ,*argv);
    puts(
        "\t--del \'values\' : remove values\n\t--noout: avoid dumping the result on stdout\n\t         used with --add or --del, it saves the catalog changes\n\t         and with --sgml it automatically updates the super catalog\n\t--no-super-update: do not update the SGML super catalog\n\t-v --verbose : provide debug information"
        );
    return 1;
  }
  xmlCheckVersion(0x526c);
  iVar15 = 1;
  do {
    pcVar9 = argv[iVar15];
    iVar4 = strcmp(pcVar9,"-");
    if ((iVar4 == 0) || (*pcVar9 != '-')) break;
    iVar4 = strcmp(pcVar9,"-verbose");
    if ((iVar4 == 0) ||
       ((iVar4 = strcmp(pcVar9,"-v"), iVar4 == 0 || (iVar4 = strcmp(pcVar9,"--verbose"), iVar4 == 0)
        ))) {
      verbose = verbose + 1;
      xmlCatalogSetDebug();
    }
    else {
      iVar4 = strcmp(pcVar9,"-noout");
      if ((iVar4 != 0) && (iVar4 = strcmp(pcVar9,"--noout"), iVar4 != 0)) {
        iVar4 = strcmp(pcVar9,"-shell");
        if ((iVar4 != 0) && (iVar4 = strcmp(pcVar9,"--shell"), iVar4 != 0)) {
          iVar4 = strcmp(pcVar9,"-sgml");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--sgml"), iVar4 == 0)) {
            sgml = sgml + 1;
          }
          else {
            iVar4 = strcmp(pcVar9,"-create");
            if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--create"), iVar4 == 0)) {
              create = create + 1;
            }
            else {
              iVar4 = strcmp(pcVar9,"-convert");
              if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--convert"), iVar4 == 0)) {
                convert = convert + 1;
              }
              else {
                iVar4 = strcmp(pcVar9,"-no-super-update");
                if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--no-super-update"), iVar4 == 0)) {
                  no_super_update = no_super_update + 1;
                }
                else {
                  iVar4 = strcmp(pcVar9,"-add");
                  if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--add"), iVar4 == 0)) {
                    iVar15 = iVar15 + 2 + (uint)(sgml == 0);
                    add = add + 1;
                  }
                  else {
                    iVar4 = strcmp(pcVar9,"-del");
                    if ((iVar4 != 0) && (iVar4 = strcmp(pcVar9,"--del"), iVar4 != 0)) {
                      main_cold_1();
                      return 1;
                    }
                    iVar15 = iVar15 + 1;
                    del = del + 1;
                  }
                }
              }
            }
          }
          goto LAB_00101710;
        }
        shell = shell + 1;
      }
      noout = 1;
    }
LAB_00101710:
    iVar15 = iVar15 + 1;
  } while (iVar15 < argc);
  iVar15 = sgml;
  uVar13 = 1;
  do {
    pcVar9 = argv[(int)uVar13];
    iVar4 = strcmp(pcVar9,"-add");
    if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--add"), iVar4 == 0)) {
      if (iVar15 == 0) {
        uVar16 = uVar13 + 3;
      }
      else {
        uVar16 = uVar13 + 2;
      }
    }
    else {
      iVar4 = strcmp(pcVar9,"-del");
      if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--del"), iVar4 == 0)) {
        uVar16 = uVar13 + 1;
        if ((uVar16 == argc) || ((iVar15 != 0 && (uVar13 + 2 == argc)))) {
          main_cold_2();
          return 1;
        }
      }
      else {
        uVar16 = uVar13;
        if (*pcVar9 != '-') {
          if ((*pcVar9 == '\0') && (filename == (char *)0x0)) {
            xmlInitializeCatalog();
          }
          else {
            filename = pcVar9;
            iVar15 = xmlLoadCatalog(pcVar9);
            if ((iVar15 < 0) && (create != 0)) {
              xmlCatalogAdd("catalog",argv[(int)uVar13],0);
            }
          }
          break;
        }
      }
    }
    uVar13 = uVar16 + 1;
  } while ((int)uVar13 < argc);
  if (convert != 0) {
    xmlCatalogConvert();
  }
  if (del == 0 && add == 0) {
    if (shell == 0) {
      iVar15 = uVar13 + 1;
      local_2e8 = 0;
      if (iVar15 < argc) {
        lVar7 = 0;
        local_2e8 = 0;
        do {
          lVar8 = xmlParseURI(argv[iVar15 + lVar7]);
          if (lVar8 == 0) {
            pcVar9 = (char *)xmlCatalogResolvePublic(argv[iVar15 + lVar7]);
            if (pcVar9 != (char *)0x0) goto LAB_001021df;
            pcVar9 = argv[iVar15 + lVar7];
            pcVar17 = "No entry for PUBLIC %s\n";
LAB_001021fe:
            printf(pcVar17,pcVar9);
            local_2e8 = 4;
          }
          else {
            xmlFreeURI(lVar8);
            pcVar9 = (char *)xmlCatalogResolveSystem(argv[iVar15 + lVar7]);
            if (pcVar9 == (char *)0x0) {
              printf("No entry for SYSTEM %s\n",argv[iVar15 + lVar7]);
              pcVar9 = (char *)xmlCatalogResolveURI(argv[iVar15 + lVar7]);
              if (pcVar9 == (char *)0x0) {
                pcVar9 = argv[iVar15 + lVar7];
                pcVar17 = "No entry for URI %s\n";
                goto LAB_001021fe;
              }
            }
LAB_001021df:
            puts(pcVar9);
            (*_xmlFree)(pcVar9);
          }
          lVar7 = lVar7 + 1;
        } while (~uVar13 + argc != (int)lVar7);
      }
    }
    else {
      pcVar9 = (char *)readline("> ");
      if (pcVar9 != (char *)0x0) {
        bVar18 = false;
        do {
          if (*pcVar9 != '\0') {
            add_history(pcVar9);
          }
          pcVar17 = pcVar9;
          if (bVar18) break;
          for (; (*pcVar17 == '\t' || (*pcVar17 == ' ')); pcVar17 = pcVar17 + 1) {
          }
          uVar10 = 0;
          while( true ) {
            bVar3 = pcVar17[uVar10];
            if (((ulong)bVar3 < 0x21) && ((0x100002601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) break;
            *(byte *)((long)&local_2d8 + uVar10) = bVar3;
            uVar10 = uVar10 + 1;
          }
          *(undefined1 *)((long)&local_2d8 + (uVar10 & 0xffffffff)) = 0;
          if (uVar10 == 0) goto LAB_001020db;
          memset(local_1c8,0,400);
          for (pcVar17 = pcVar17 + uVar10; (*pcVar17 == '\t' || (*pcVar17 == ' '));
              pcVar17 = pcVar17 + 1) {
          }
          uVar10 = 0;
          while( true ) {
            bVar3 = pcVar17[uVar10];
            if ((bVar3 < 0xe) && ((0x2401U >> (bVar3 & 0x1f) & 1) != 0)) break;
            local_1c8[uVar10] = bVar3;
            uVar10 = uVar10 + 1;
          }
          local_1c8[uVar10 & 0xffffffff] = 0;
          iVar15 = 0;
          memset(local_268,0,0xa0);
          if (local_1c8[0] != 0) {
            iVar4 = 0;
            iVar15 = 0;
            pbVar12 = local_1c8;
LAB_00101d36:
            do {
              bVar3 = *pbVar12;
              if (bVar3 < 0x20) {
                if (bVar3 == 9) goto LAB_00101d71;
LAB_00101d95:
                local_268[iVar4] = (long)pbVar12;
                while ((0x20 < (ulong)*pbVar12 ||
                       ((0x100000201U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))) {
                  pbVar12 = pbVar12 + 1;
                }
LAB_00101db4:
                *pbVar12 = 0;
                iVar15 = iVar15 + 1;
                iVar4 = iVar4 + 1;
                pbVar12 = pbVar12 + 1;
              }
              else {
                if (bVar3 == 0x20) {
LAB_00101d71:
                  pbVar12 = pbVar12 + 1;
                  goto LAB_00101d36;
                }
                if (bVar3 == 0x22) {
                  pbVar12 = pbVar12 + 1;
                  local_268[iVar4] = (long)pbVar12;
                  for (; *pbVar12 != 0; pbVar12 = pbVar12 + 1) {
                    if (*pbVar12 == 0x22) goto LAB_00101db4;
                  }
                }
                else {
                  if (bVar3 != 0x27) goto LAB_00101d95;
                  pbVar12 = pbVar12 + 1;
                  local_268[iVar4] = (long)pbVar12;
                  for (; *pbVar12 != 0; pbVar12 = pbVar12 + 1) {
                    if (*pbVar12 == 0x27) goto LAB_00101db4;
                  }
                }
              }
            } while (*pbVar12 != 0);
          }
          if (((cStack_2d4 == '\0' && local_2d8 == 0x74697865) ||
              (cStack_2d4 == '\0' && local_2d8 == 0x74697571)) || (local_2d8 == 0x657962)) {
            free(pcVar9);
            break;
          }
          if (CONCAT13(uStack_2d2,CONCAT12(uStack_2d3,CONCAT11(cStack_2d4,local_2d8._3_1_))) ==
              0x63696c && local_2d8 == 0x6c627570) {
            if (iVar15 != 1) {
              pcVar17 = "public requires 1 arguments";
              goto LAB_001020d6;
            }
            pcVar17 = (char *)xmlCatalogResolvePublic(local_268[0]);
            if (pcVar17 != (char *)0x0) goto LAB_00101ead;
            pcVar17 = "No entry for PUBLIC %s\n";
LAB_0010207c:
            printf(pcVar17);
          }
          else {
            if (CONCAT13(uStack_2d2,CONCAT12(uStack_2d3,CONCAT11(cStack_2d4,local_2d8._3_1_))) ==
                0x6d6574 && local_2d8 == 0x74737973) {
              if (iVar15 == 1) {
                pcVar17 = (char *)xmlCatalogResolveSystem(local_268[0]);
                if (pcVar17 == (char *)0x0) {
                  pcVar17 = "No entry for SYSTEM %s\n";
                  goto LAB_0010207c;
                }
LAB_00101ead:
                puts(pcVar17);
LAB_00101ebb:
                (*_xmlFree)(pcVar17);
                goto LAB_001020db;
              }
              pcVar17 = "system requires 1 arguments";
            }
            else if (local_2d8 == 0x6c6564) {
              if (iVar15 == 1) {
                iVar15 = xmlCatalogRemove(local_268[0]);
                if (0 < iVar15) goto LAB_001020db;
                pcVar17 = "del command failed";
              }
              else {
                pcVar17 = "del requires 1";
              }
            }
            else if (local_2d8 == 0x646461) {
              if (iVar15 - 4U < 0xfffffffe) {
                pcVar17 = "add requires 2 or 3 arguments";
              }
              else {
                lVar7 = local_268[2];
                lVar8 = local_268[1];
                if (local_268[2] == 0) {
                  lVar7 = local_268[1];
                  lVar8 = 0;
                }
                iVar15 = xmlCatalogAdd(local_268[0],lVar8,lVar7);
                if (iVar15 == 0) goto LAB_001020db;
                pcVar17 = "add command failed";
              }
            }
            else if (CONCAT17(uStack_2d1,
                              CONCAT16(uStack_2d2,
                                       CONCAT15(uStack_2d3,CONCAT14(cStack_2d4,local_2d8)))) ==
                     0x65766c6f736572) {
              if (iVar15 == 2) {
                pcVar17 = (char *)xmlCatalogResolve(local_268[0]);
                if (pcVar17 != (char *)0x0) {
                  puts(pcVar17);
                  goto LAB_00101ebb;
                }
                pcVar17 = "Resolver failed to find an answer";
              }
              else {
                pcVar17 = "resolve requires 2 arguments";
              }
            }
            else if (cStack_2d4 == '\0' && local_2d8 == 0x706d7564) {
              if (iVar15 == 0) {
                xmlCatalogDump(_stdout);
                goto LAB_001020db;
              }
              pcVar17 = "dump has no arguments";
            }
            else if (CONCAT11(uStack_2d3,cStack_2d4) == 0x67 && local_2d8 == 0x75626564) {
              if (iVar15 == 0) {
                verbose = verbose + 1;
LAB_0010213d:
                xmlCatalogSetDebug(verbose);
                goto LAB_001020db;
              }
              pcVar17 = "debug has no arguments";
            }
            else if (CONCAT11(uStack_2d3,cStack_2d4) == 0x74 && local_2d8 == 0x65697571) {
              if (iVar15 == 0) {
                if (0 < verbose) {
                  verbose = verbose + -1;
                }
                goto LAB_0010213d;
              }
              pcVar17 = "quiet has no arguments";
            }
            else {
              if (cStack_2d4 != '\0' || local_2d8 != 0x706c6568) {
                printf("Unrecognized command %s\n");
              }
              puts("Commands available:");
              puts("\tpublic PublicID: make a PUBLIC identifier lookup");
              puts("\tsystem SystemID: make a SYSTEM identifier lookup");
              puts("\tresolve PublicID SystemID: do a full resolver lookup");
              puts("\tadd \'type\' \'orig\' \'replace\' : add an entry");
              puts("\tdel \'values\' : remove values");
              puts("\tdump: print the current catalog state");
              puts("\tdebug: increase the verbosity level");
              puts("\tquiet: decrease the verbosity level");
              pcVar17 = "\texit:  quit the shell";
            }
LAB_001020d6:
            puts(pcVar17);
          }
LAB_001020db:
          free(pcVar9);
          pcVar9 = (char *)readline("> ");
          bVar18 = pcVar9 == (char *)0x0;
        } while (!bVar18);
      }
      local_2e8 = 0;
    }
  }
  else {
    local_2e8 = 0;
    iVar15 = 1;
    do {
      pcVar9 = argv[iVar15];
      iVar4 = strcmp(pcVar9,"-");
      if (iVar4 == 0) break;
      iVar4 = iVar15;
      if ((*pcVar9 == '-') &&
         (((iVar5 = strcmp(pcVar9,"-add"), iVar5 == 0 ||
           (iVar6 = strcmp(pcVar9,"--add"), iVar6 == 0)) ||
          ((iVar6 = strcmp(pcVar9,"-del"), iVar6 == 0 ||
           (iVar6 = strcmp(pcVar9,"--del"), iVar6 == 0)))))) {
        ppcVar2 = argv + iVar15;
        if (sgml == 0) {
          if ((iVar5 == 0) || (iVar5 = strcmp(pcVar9,"--add"), iVar5 == 0)) {
            pcVar9 = argv[(long)iVar15 + 3];
            if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
              pcVar17 = ppcVar2[1];
              pcVar9 = ppcVar2[2];
              pcVar14 = (char *)0x0;
            }
            else {
              pcVar17 = ppcVar2[1];
              pcVar14 = ppcVar2[2];
            }
            iVar5 = xmlCatalogAdd(pcVar17,pcVar14,pcVar9);
            iVar4 = iVar15 + 3;
            if (iVar5 != 0) {
              puts("add command failed");
              local_2e8 = 3;
            }
          }
          else {
            iVar5 = strcmp(pcVar9,"-del");
            if ((iVar5 == 0) || (iVar5 = strcmp(pcVar9,"--del"), iVar5 == 0)) {
              iVar4 = iVar15 + 1;
              iVar15 = xmlCatalogRemove(argv[(long)iVar15 + 1]);
              if (iVar15 < 0) {
                main_cold_7();
                local_2e8 = 1;
              }
            }
          }
        }
        else {
          ppcVar1 = ppcVar2 + 1;
          lVar7 = xmlLoadSGMLSuperCatalog(ppcVar2[1]);
          pcVar9 = *ppcVar2;
          iVar4 = strcmp(pcVar9,"-add");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"--add"), iVar4 == 0)) {
            if (lVar7 == 0) {
              lVar7 = xmlNewCatalog(1);
            }
            xmlACatalogAdd(lVar7,"CATALOG",ppcVar2[2],0);
            if (no_super_update != 0) goto LAB_001019de;
            lVar8 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog");
            if (lVar8 == 0) {
              lVar8 = xmlNewCatalog(1);
            }
            xmlACatalogAdd(lVar8,"CATALOG",*ppcVar1,0);
          }
          else {
            if ((lVar7 == 0) || (iVar4 = xmlACatalogRemove(lVar7,ppcVar2[2]), iVar4 < 0)) {
              main_cold_3();
              local_2e8 = 1;
            }
            if (lVar7 == 0) {
LAB_001019de:
              lVar8 = 0;
            }
            else if ((((no_super_update == 0) && ((noout & 1) != 0)) &&
                     (iVar4 = xmlCatalogIsEmpty(lVar7), iVar4 != 0)) &&
                    (lVar8 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog"), lVar8 != 0)) {
              iVar4 = xmlACatalogRemove(lVar8,*ppcVar1);
              if (iVar4 < 0) {
                main_cold_4();
                local_2e8 = 1;
              }
            }
            else {
              lVar8 = 0;
            }
          }
          if (noout == 1) {
            iVar4 = xmlCatalogIsEmpty(lVar7);
            if (iVar4 == 0) {
              pFVar11 = fopen64(*ppcVar1,"w");
              if (pFVar11 == (FILE *)0x0) {
                main_cold_5();
                local_2e8 = 2;
              }
              else {
                xmlACatalogDump(lVar7,pFVar11);
                fclose(pFVar11);
              }
            }
            else {
              remove(*ppcVar1);
            }
            if ((lVar8 != 0) && (no_super_update == 0)) {
              iVar4 = xmlCatalogIsEmpty(lVar8);
              if (iVar4 == 0) {
                pFVar11 = fopen64("/usr/local/etc/sgml/catalog","w");
                if (pFVar11 == (FILE *)0x0) {
                  main_cold_6();
                  local_2e8 = 2;
                }
                else {
                  xmlACatalogDump(lVar8,pFVar11);
                  fclose(pFVar11);
                }
              }
              else {
                remove("/usr/local/etc/sgml/catalog");
              }
            }
          }
          else {
            xmlACatalogDump(lVar7,_stdout);
          }
          iVar4 = iVar15 + 2;
        }
      }
      iVar15 = iVar4 + 1;
    } while (iVar15 < argc);
  }
  if ((sgml == 0) && (((add != 0 || (del != 0)) || ((create != 0 || (convert != 0)))))) {
    pFVar11 = _stdout;
    if ((((filename != (char *)0x0 & noout) == 1) && (*filename != '\0')) &&
       (pFVar11 = fopen64(filename,"w"), pFVar11 == (FILE *)0x0)) {
      main_cold_8();
      local_2e8 = 2;
    }
    else {
      xmlCatalogDump(pFVar11);
    }
  }
  xmlCleanupParser();
  xmlMemoryDump();
  return local_2e8;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int ret;
    int exit_value = 0;


    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }

    LIBXML_TEST_VERSION
    for (i = 1; i < argc ; i++) {
	if (!strcmp(argv[i], "-"))
	    break;

	if (argv[i][0] != '-')
	    break;
	if ((!strcmp(argv[i], "-verbose")) ||
	    (!strcmp(argv[i], "-v")) ||
	    (!strcmp(argv[i], "--verbose"))) {
	    verbose++;
	    xmlCatalogSetDebug(verbose);
	} else if ((!strcmp(argv[i], "-noout")) ||
	    (!strcmp(argv[i], "--noout"))) {
            noout = 1;
	} else if ((!strcmp(argv[i], "-shell")) ||
	    (!strcmp(argv[i], "--shell"))) {
	    shell++;
            noout = 1;
	} else if ((!strcmp(argv[i], "-sgml")) ||
	    (!strcmp(argv[i], "--sgml"))) {
	    sgml++;
	} else if ((!strcmp(argv[i], "-create")) ||
	    (!strcmp(argv[i], "--create"))) {
	    create++;
	} else if ((!strcmp(argv[i], "-convert")) ||
	    (!strcmp(argv[i], "--convert"))) {
	    convert++;
	} else if ((!strcmp(argv[i], "-no-super-update")) ||
	    (!strcmp(argv[i], "--no-super-update"))) {
	    no_super_update++;
	} else if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    add++;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;
	    del++;
	} else {
	    fprintf(stderr, "Unknown option %s\n", argv[i]);
	    usage(argv[0]);
	    return(1);
	}
    }

    for (i = 1; i < argc; i++) {
	if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    continue;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;

	    /* No catalog entry specified */
	    if (i == argc || (sgml && i + 1 == argc)) {
		fprintf(stderr, "No catalog entry specified to remove from\n");
		usage (argv[0]);
		return(1);
	    }

	    continue;
	} else if (argv[i][0] == '-')
	    continue;

	if (filename == NULL && argv[i][0] == '\0') {
	    /* Interpret empty-string catalog specification as
	       a shortcut for a default system catalog. */
	    xmlInitializeCatalog();
	} else {
	    filename = argv[i];
	    ret = xmlLoadCatalog(argv[i]);
	    if ((ret < 0) && (create)) {
		xmlCatalogAdd(BAD_CAST "catalog", BAD_CAST argv[i], NULL);
	    }
	}
	break;
    }

    if (convert)
        ret = xmlCatalogConvert();

    if ((add) || (del)) {
	for (i = 1; i < argc ; i++) {
	    if (!strcmp(argv[i], "-"))
		break;

	    if (argv[i][0] != '-')
		continue;
	    if (strcmp(argv[i], "-add") && strcmp(argv[i], "--add") &&
		strcmp(argv[i], "-del") && strcmp(argv[i], "--del"))
		continue;

	    if (sgml) {
		/*
		 * Maintenance of SGML catalogs.
		 */
		xmlCatalogPtr catal = NULL;
		xmlCatalogPtr super = NULL;

		catal = xmlLoadSGMLSuperCatalog(argv[i + 1]);

		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
		    if (catal == NULL)
			catal = xmlNewCatalog(1);
		    xmlACatalogAdd(catal, BAD_CAST "CATALOG",
					 BAD_CAST argv[i + 2], NULL);

		    if (!no_super_update) {
			super = xmlLoadSGMLSuperCatalog(XML_SGML_DEFAULT_CATALOG);
			if (super == NULL)
			    super = xmlNewCatalog(1);

			xmlACatalogAdd(super, BAD_CAST "CATALOG",
					     BAD_CAST argv[i + 1], NULL);
		    }
		} else {
		    if (catal != NULL)
			ret = xmlACatalogRemove(catal, BAD_CAST argv[i + 2]);
		    else
			ret = -1;
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry from %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    if ((!no_super_update) && (noout) && (catal != NULL) &&
			(xmlCatalogIsEmpty(catal))) {
			super = xmlLoadSGMLSuperCatalog(
				   XML_SGML_DEFAULT_CATALOG);
			if (super != NULL) {
			    ret = xmlACatalogRemove(super,
				    BAD_CAST argv[i + 1]);
			    if (ret < 0) {
				fprintf(stderr,
					"Failed to remove entry from %s\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 1;
			    }
			}
		    }
		}
		if (noout) {
		    FILE *out;

		    if (xmlCatalogIsEmpty(catal)) {
			remove(argv[i + 1]);
		    } else {
			out = fopen(argv[i + 1], "w");
			if (out == NULL) {
			    fprintf(stderr, "could not open %s for saving\n",
				    argv[i + 1]);
			    exit_value = 2;
			    noout = 0;
			} else {
			    xmlACatalogDump(catal, out);
			    fclose(out);
			}
		    }
		    if (!no_super_update && super != NULL) {
			if (xmlCatalogIsEmpty(super)) {
			    remove(XML_SGML_DEFAULT_CATALOG);
			} else {
			    out = fopen(XML_SGML_DEFAULT_CATALOG, "w");
			    if (out == NULL) {
				fprintf(stderr,
					"could not open %s for saving\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 2;
				noout = 0;
			    } else {

				xmlACatalogDump(super, out);
				fclose(out);
			    }
			}
		    }
		} else {
		    xmlACatalogDump(catal, stdout);
		}
		i += 2;
	    } else {
		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
			if ((argv[i + 3] == NULL) || (argv[i + 3][0] == 0))
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1], NULL,
						BAD_CAST argv[i + 2]);
			else
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1],
						BAD_CAST argv[i + 2],
						BAD_CAST argv[i + 3]);
			if (ret != 0) {
			    printf("add command failed\n");
			    exit_value = 3;
			}
			i += 3;
		} else if ((!strcmp(argv[i], "-del")) ||
		    (!strcmp(argv[i], "--del"))) {
		    ret = xmlCatalogRemove(BAD_CAST argv[i + 1]);
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    i += 1;
		}
	    }
	}

    } else if (shell) {
	usershell();
    } else {
	for (i++; i < argc; i++) {
	    xmlURIPtr uri;
	    xmlChar *ans;

	    uri = xmlParseURI(argv[i]);
	    if (uri == NULL) {
		ans = xmlCatalogResolvePublic((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for PUBLIC %s\n", argv[i]);
		    exit_value = 4;
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    } else {
                xmlFreeURI(uri);
		ans = xmlCatalogResolveSystem((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for SYSTEM %s\n", argv[i]);
		    ans = xmlCatalogResolveURI ((const xmlChar *) argv[i]);
		    if (ans == NULL) {
			printf ("No entry for URI %s\n", argv[i]);
		        exit_value = 4;
		    } else {
		        printf("%s\n", (char *) ans);
			xmlFree (ans);
		    }
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    }
	}
    }
    if ((!sgml) && ((add) || (del) || (create) || (convert))) {
	if (noout && filename && *filename) {
	    FILE *out;

	    out = fopen(filename, "w");
	    if (out == NULL) {
		fprintf(stderr, "could not open %s for saving\n", filename);
		exit_value = 2;
		noout = 0;
	    } else {
		xmlCatalogDump(out);
	    }
	} else {
	    xmlCatalogDump(stdout);
	}
    }

    /*
     * Cleanup and check for memory leaks
     */
    xmlCleanupParser();
    xmlMemoryDump();
    return(exit_value);
}